

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

bool __thiscall
cmCTestVC::RunChild(cmCTestVC *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *cmd,OutputParser *out,OutputParser *err,string *workDir,Encoding encoding)

{
  pointer pcVar1;
  ostream *poVar2;
  cmUVProcessChainBuilder *this_00;
  bool bVar3;
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> status;
  cmUVProcessChainBuilder builder;
  string local_c8;
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> local_a8;
  undefined1 local_90 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_78;
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  poVar2 = this->Log;
  ComputeCommandLine((string *)local_90,cmd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_90._0_8_,local_90._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_90._0_8_ != (long)local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_90);
  if (workDir->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)workDir);
  }
  this_00 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_90,cmd);
  pcVar1 = (workDir->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + workDir->_M_string_length);
  cmUVProcessChainBuilder::SetWorkingDirectory(this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  cmProcessTools::RunProcess(&local_a8,(cmUVProcessChainBuilder *)local_90,out,err,encoding);
  if ((local_a8.
       super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>.
       _M_impl.super__Vector_impl_data._M_start)->SpawnResult == 0) {
    bVar3 = (local_a8.
             super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
             ._M_impl.super__Vector_impl_data._M_start)->ExitStatus == 0;
  }
  else {
    bVar3 = false;
  }
  operator_delete(local_a8.
                  super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_a8.
                        super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.
                        super__Vector_base<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != local_50) {
    operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_78);
  return bVar3;
}

Assistant:

bool cmCTestVC::RunChild(const std::vector<std::string>& cmd,
                         OutputParser* out, OutputParser* err,
                         std::string workDir, Encoding encoding)
{
  this->Log << cmCTestVC::ComputeCommandLine(cmd) << "\n";

  cmUVProcessChainBuilder builder;
  if (workDir.empty()) {
    workDir = this->SourceDirectory;
  }
  builder.AddCommand(cmd).SetWorkingDirectory(workDir);
  auto status = cmCTestVC::RunProcess(builder, out, err, encoding);
  return status.front().SpawnResult == 0 && status.front().ExitStatus == 0;
}